

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

float Vector3Distance(Vector3 v1,Vector3 v2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = v2.x - v1.x;
  fVar2 = v2.y - v1.y;
  fVar3 = v2.z - v1.z;
  return SQRT(fVar3 * fVar3 + fVar1 * fVar1 + fVar2 * fVar2);
}

Assistant:

RMAPI float Vector3Distance(Vector3 v1, Vector3 v2)
{
    float result = 0.0f;

    float dx = v2.x - v1.x;
    float dy = v2.y - v1.y;
    float dz = v2.z - v1.z;
    result = sqrtf(dx*dx + dy*dy + dz*dz);

    return result;
}